

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O2

UBool icu_63::isWellFormed(UnicodeString *s)

{
  short sVar1;
  int32_t srcLength;
  UErrorCode errorCode;
  UErrorCode local_14;
  char16_t *local_10;
  
  local_14 = U_ZERO_ERROR;
  local_10 = UnicodeString::getBuffer(s);
  sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    srcLength = (s->fUnion).fFields.fLength;
  }
  else {
    srcLength = (int)sVar1 >> 5;
  }
  u_strToUTF8_63((char *)0x0,0,(int32_t *)0x0,local_10,srcLength,&local_14);
  return local_14 == U_BUFFER_OVERFLOW_ERROR || local_14 < U_ILLEGAL_ARGUMENT_ERROR;
}

Assistant:

static UBool isWellFormed(const UnicodeString &s) {
    UErrorCode errorCode=U_ZERO_ERROR;
    u_strToUTF8(NULL, 0, NULL, toUCharPtr(s.getBuffer()), s.length(), &errorCode);
    return U_SUCCESS(errorCode) || errorCode==U_BUFFER_OVERFLOW_ERROR;
}